

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-quantize-fns.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  size_type sVar2;
  int iVar3;
  size_t i_2;
  void *__s_00;
  void *__s_01;
  long *plVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  undefined8 uVar8;
  void *__s_02;
  undefined8 *puVar9;
  value_type_conflict1 *__val;
  uint uVar10;
  value_type *__val_3;
  value_type *__val_1;
  uint uVar11;
  uint uVar12;
  size_t i;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  double sum;
  float fVar19;
  float fVar20;
  float fVar21;
  float local_54;
  string arg;
  
  arg._M_dataplus._M_p = (pointer)&arg.field_2;
  arg._M_string_length = 0;
  arg.field_2._M_local_buf[0] = '\0';
  bVar1 = false;
  bVar15 = 1 < argc;
  if (1 < argc) {
    bVar1 = false;
    uVar14 = 2;
    do {
      sVar2 = arg._M_string_length;
      __s = argv[uVar14 - 1];
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&arg,0,(char *)sVar2,(ulong)__s);
      iVar3 = std::__cxx11::string::compare((char *)&arg);
      if (iVar3 != 0) {
        main_cold_1();
        uVar12 = 1;
        goto LAB_00101370;
      }
      bVar15 = uVar14 < (uint)argc;
      bVar1 = true;
      bVar16 = uVar14 != (uint)argc;
      uVar14 = uVar14 + 1;
    } while (bVar16);
  }
  uVar12 = 0;
LAB_00101370:
  if (!bVar15) {
    __s_00 = operator_new(0x4000);
    memset(__s_00,0,0x4000);
    __s_01 = operator_new(0x4000);
    lVar13 = 0;
    memset(__s_01,0,0x4000);
    do {
      fVar17 = cosf((float)lVar13);
      *(float *)((long)__s_00 + lVar13 * 4) = fVar17 + fVar17 + 0.1;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x1000);
    lVar13 = 0;
    do {
      fVar17 = cosf((float)lVar13 + 1.0);
      *(float *)((long)__s_01 + lVar13 * 4) = fVar17 + fVar17 + 0.1;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x1000);
    ggml_cpu_init();
    uVar12 = 0;
    uVar11 = 0;
    do {
      lVar13 = ggml_get_type_traits(uVar11);
      plVar4 = (long *)ggml_get_type_traits_cpu(uVar11);
      if (*(long *)(lVar13 + 8) != 0) {
        ggml_type_name(uVar11);
        printf("Testing %s\n");
        ggml_quantize_init(uVar11);
        if ((*plVar4 != 0) && (*(long *)(lVar13 + 0x28) != 0)) {
          pvVar5 = operator_new(0x2000);
          memset(pvVar5,0,0x2000);
          pvVar6 = operator_new(0x4000);
          memset(pvVar6,0,0x4000);
          (*(code *)*plVar4)(__s_00,pvVar5,0x1000);
          (**(code **)(lVar13 + 0x28))(pvVar5,pvVar6,0x1000);
          fVar17 = 0.0;
          lVar7 = 0;
          do {
            fVar19 = *(float *)((long)__s_00 + lVar7 * 4) - *(float *)((long)pvVar6 + lVar7 * 4);
            fVar17 = fVar17 + fVar19 * fVar19;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0x1000);
          if (fVar17 < 0.0) {
            fVar17 = sqrtf(fVar17);
          }
          else {
            fVar17 = SQRT(fVar17);
          }
          fVar17 = fVar17 * 0.00024414062;
          operator_delete(pvVar6,0x4000);
          operator_delete(pvVar5,0x2000);
          uVar10 = uVar11 & 0x3e;
          fVar19 = 0.01;
          if (uVar10 != 0x22) {
            if ((int)uVar11 < 0x15) {
              fVar19 = 0.0075;
              if (uVar11 != 10) {
                if (uVar11 == 0xb) goto LAB_001015b9;
LAB_001015a2:
                fVar19 = *(float *)(&DAT_00102010 + (ulong)(uVar11 == 0x12) * 4);
              }
            }
            else if (uVar11 == 0x15) {
LAB_001015b9:
              fVar19 = 0.004;
            }
            else {
              fVar19 = 0.0075;
              if (uVar11 != 0x16) goto LAB_001015a2;
            }
          }
          if (bVar1 || fVar19 <= fVar17) {
            uVar8 = ggml_type_name(uVar11);
            printf("%5s absolute quantization error:    %s (%f)\n",(double)fVar17,uVar8,
                   RESULT_STR[fVar19 <= fVar17]);
          }
          pvVar5 = operator_new(0x2000);
          memset(pvVar5,0,0x2000);
          pvVar6 = operator_new(0x4000);
          memset(pvVar6,0,0x4000);
          __s_02 = operator_new(0x4000);
          memset(__s_02,0,0x4000);
          (*(code *)*plVar4)(__s_00,pvVar5,0x1000);
          (**(code **)(lVar13 + 0x28))(pvVar5,pvVar6,0x1000);
          (**(code **)(lVar13 + 0x30))(__s_00,pvVar5,0x1000);
          (**(code **)(lVar13 + 0x28))(pvVar5,__s_02,0x1000);
          fVar18 = 0.0;
          lVar13 = 0;
          do {
            fVar20 = *(float *)((long)pvVar6 + lVar13 * 4) - *(float *)((long)__s_02 + lVar13 * 4);
            fVar18 = fVar18 + fVar20 * fVar20;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x1000);
          if (fVar18 < 0.0) {
            fVar18 = sqrtf(fVar18);
          }
          else {
            fVar18 = SQRT(fVar18);
          }
          fVar18 = fVar18 * 0.00024414062;
          operator_delete(__s_02,0x4000);
          operator_delete(pvVar6,0x4000);
          operator_delete(pvVar5,0x2000);
          if (bVar1 || 0.0001 <= fVar18) {
            uVar8 = ggml_type_name(uVar11);
            printf("%5s reference implementation error: %s (%f)\n",(double)fVar18,uVar8,
                   RESULT_STR[0.0001 <= fVar18]);
          }
          pvVar5 = operator_new(0x2000);
          memset(pvVar5,0,0x2000);
          pvVar6 = operator_new(0x2000);
          memset(pvVar6,0,0x2000);
          puVar9 = (undefined8 *)ggml_get_type_traits_cpu((int)plVar4[2]);
          (*(code *)*plVar4)(__s_00,pvVar5,0x1000);
          (*(code *)*puVar9)(__s_01,pvVar6,0x1000);
          local_54 = INFINITY;
          (*(code *)plVar4[1])(0x1000,&local_54,0,pvVar5,0,pvVar6,0,1);
          fVar20 = 0.0;
          lVar13 = 0;
          do {
            fVar20 = fVar20 + *(float *)((long)__s_00 + lVar13 * 4) *
                              *(float *)((long)__s_01 + lVar13 * 4);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x1000);
          fVar21 = ABS(local_54 - fVar20) * 0.00024414062;
          operator_delete(pvVar6,0x2000);
          operator_delete(pvVar5,0x2000);
          fVar20 = 0.04;
          if ((uVar10 != 0x10) &&
             ((0x16 < uVar11 || (fVar20 = 0.04, (0x640400U >> (uVar11 & 0x1f) & 1) == 0)))) {
            fVar20 = *(float *)(&DAT_00102018 + (ulong)(uVar10 == 0x22) * 4);
          }
          uVar12 = uVar12 + (fVar19 <= fVar17) + (uint)(0.0001 <= fVar18) + (uint)(fVar20 <= fVar21)
          ;
          if (fVar20 <= fVar21 || bVar1) {
            uVar8 = ggml_type_name(uVar11);
            printf("%5s dot product error:              %s (%f)\n",(double)fVar21,uVar8,
                   RESULT_STR[fVar20 <= fVar21]);
          }
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != 0x27);
    if (bVar1 || uVar12 != 0) {
      printf("%d tests failed\n",(ulong)uVar12);
    }
    uVar12 = (uint)(0 < (int)uVar12);
    operator_delete(__s_01,0x4000);
    operator_delete(__s_00,0x4000);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg._M_dataplus._M_p != &arg.field_2) {
    operator_delete(arg._M_dataplus._M_p,
                    CONCAT71(arg.field_2._M_allocated_capacity._1_7_,arg.field_2._M_local_buf[0]) +
                    1);
  }
  return uVar12;
}

Assistant:

int main(int argc, char * argv[]) {
    bool verbose = false;
    const size_t test_size = 32 * 128;

    std::string arg;
    for (int i = 1; i < argc; i++) {
        arg = argv[i];

        if (arg == "-v") {
            verbose = true;
        } else {
            fprintf(stderr, "error: unknown argument: %s\n", arg.c_str());
            return 1;
        }
    }

    std::vector<float> test_data(test_size);
    std::vector<float> test_data2(test_size);

    generate_data(0.0, test_data.size(), test_data.data());
    generate_data(1.0, test_data2.size(), test_data2.data());

    ggml_cpu_init();

    int num_failed = 0;
    bool failed = false;

    for (int i = 0; i < GGML_TYPE_COUNT; i++) {
        ggml_type type = (ggml_type) i;
        const auto * qfns = ggml_get_type_traits(type);
        const auto * qfns_cpu = ggml_get_type_traits_cpu(type);

        // deprecated - skip
        if (qfns->blck_size == 0) {
            continue;
        }

        const ggml_type ei = (ggml_type)i;

        printf("Testing %s\n", ggml_type_name((ggml_type) i));
        ggml_quantize_init(ei);

        if (qfns_cpu->from_float && qfns->to_float) {
            const float total_error = total_quantization_error(qfns, qfns_cpu, test_size, test_data.data());
            const float max_quantization_error =
                type == GGML_TYPE_TQ1_0   ? MAX_QUANTIZATION_TOTAL_ERROR_TERNARY :
                type == GGML_TYPE_TQ2_0   ? MAX_QUANTIZATION_TOTAL_ERROR_TERNARY :
                type == GGML_TYPE_Q2_K    ? MAX_QUANTIZATION_TOTAL_ERROR_2BITS :
                type == GGML_TYPE_IQ2_S   ? MAX_QUANTIZATION_TOTAL_ERROR_2BITS :
                type == GGML_TYPE_Q3_K    ? MAX_QUANTIZATION_TOTAL_ERROR_3BITS :
                type == GGML_TYPE_IQ3_S   ? MAX_QUANTIZATION_TOTAL_ERROR_3BITS :
                type == GGML_TYPE_IQ3_XXS ? MAX_QUANTIZATION_TOTAL_ERROR_3BITS_XXS : MAX_QUANTIZATION_TOTAL_ERROR;
            failed = !(total_error < max_quantization_error);
            num_failed += failed;
            if (failed || verbose) {
                printf("%5s absolute quantization error:    %s (%f)\n", ggml_type_name(type), RESULT_STR[failed], total_error);
            }

            const float reference_error = reference_quantization_error(qfns, qfns_cpu, test_size, test_data.data());
            failed = !(reference_error < MAX_QUANTIZATION_REFERENCE_ERROR);
            num_failed += failed;
            if (failed || verbose) {
                printf("%5s reference implementation error: %s (%f)\n", ggml_type_name(type), RESULT_STR[failed], reference_error);
            }

            const float vec_dot_error = dot_product_error(qfns, qfns_cpu, test_size, test_data.data(), test_data2.data());
            const float max_allowed_error = type == GGML_TYPE_Q2_K || type == GGML_TYPE_IQ2_XS || type == GGML_TYPE_IQ2_XXS ||
                                            type == GGML_TYPE_IQ3_XXS || type == GGML_TYPE_IQ3_S || type == GGML_TYPE_IQ2_S
                                          ? MAX_DOT_PRODUCT_ERROR_LOWBIT
                                          : type == GGML_TYPE_TQ1_0 || type == GGML_TYPE_TQ2_0
                                          ? MAX_DOT_PRODUCT_ERROR_TERNARY
                                          : MAX_DOT_PRODUCT_ERROR;
            failed = !(vec_dot_error < max_allowed_error);
            num_failed += failed;
            if (failed || verbose) {
                printf("%5s dot product error:              %s (%f)\n", ggml_type_name(type), RESULT_STR[failed], vec_dot_error);
            }
        }
    }

    if (num_failed || verbose) {
        printf("%d tests failed\n", num_failed);
    }

    return num_failed > 0;
}